

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O2

Expression *
slang::ast::UnbasedUnsizedIntegerLiteral::fromSyntax
          (Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  Type *args;
  UnbasedUnsizedIntegerLiteral *pUVar1;
  logic_t val;
  SourceRange local_30;
  
  if ((syntax->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind ==
      UnbasedUnsizedLiteralExpression) {
    val = parsing::Token::bitValue(&syntax->literal);
    args = Compilation::getType
                     (compilation,1,
                      (bitmask<slang::ast::IntegralFlags>)
                      ((val.value == '@' || val.value == 0x80) * '\x02'));
    local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    pUVar1 = BumpAllocator::
             emplace<slang::ast::UnbasedUnsizedIntegerLiteral,slang::ast::Type_const&,slang::logic_t&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,args,&val,&local_30);
    return &pUVar1->super_Expression;
  }
  assert::assertFailed
            ("syntax.kind == SyntaxKind::UnbasedUnsizedLiteralExpression",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/LiteralExpressions.cpp"
             ,0x84,
             "static Expression &slang::ast::UnbasedUnsizedIntegerLiteral::fromSyntax(Compilation &, const LiteralExpressionSyntax &)"
            );
}

Assistant:

Expression& UnbasedUnsizedIntegerLiteral::fromSyntax(Compilation& compilation,
                                                     const LiteralExpressionSyntax& syntax) {
    ASSERT(syntax.kind == SyntaxKind::UnbasedUnsizedLiteralExpression);

    // UnsizedUnbasedLiteralExpressions default to a size of 1 in an undetermined
    // context, but can grow to be wider during propagation.
    logic_t val = syntax.literal.bitValue();
    return *compilation.emplace<UnbasedUnsizedIntegerLiteral>(
        compilation.getType(1,
                            val.isUnknown() ? IntegralFlags::FourState : IntegralFlags::TwoState),
        val, syntax.sourceRange());
}